

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>::
emplace<QRestAccessManagerPrivate::CallerInfo_const&>
          (QHash<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo> *this,QNetworkReply **key,
          CallerInfo *args)

{
  Data *pDVar1;
  ulong uVar2;
  _Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false> _Var3;
  Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *pDVar4;
  long in_FS_OFFSET;
  piter pVar5;
  CallerInfo local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
LAB_0022298e:
    pDVar4 = *(Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> **)
              this;
    local_40.contextObject.wp.d = pDVar1;
    if ((pDVar4 == (Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>
                    *)0x0) ||
       (1 < (uint)(pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar4 = QHashPrivate::
               Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>::
               detached(pDVar4);
      *(Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> **)this =
           pDVar4;
    }
    pVar5 = (piter)emplace_helper<QRestAccessManagerPrivate::CallerInfo_const&>(this,key,args);
    QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>::~QHash
              ((QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *)&local_40);
  }
  else {
    if (1 < (uint)(pDVar1->weakref)._q_value.super___atomic_base<int>._M_i) {
      if ((pDVar1 != (Data *)0x0) &&
         ((pDVar1->weakref)._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
             (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_0022298e;
    }
    uVar2._0_4_ = pDVar1[1].weakref;
    uVar2._4_4_ = pDVar1[1].strongref;
    if (pDVar1->destroyer < (DestroyerFn)(uVar2 >> 1)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar5 = (piter)emplace_helper<QRestAccessManagerPrivate::CallerInfo_const&>(this,key,args);
        return (iterator)pVar5;
      }
      goto LAB_00222a83;
    }
    local_40.contextObject.wp.d = (args->contextObject).wp.d;
    local_40.contextObject.wp.value = (args->contextObject).wp.value;
    if (local_40.contextObject.wp.d != (Data *)0x0) {
      LOCK();
      ((local_40.contextObject.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((local_40.contextObject.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    _Var3._M_head_impl =
         (args->slot).obj._M_t.
         super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t
         .super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
         super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl;
    if (_Var3._M_head_impl != (QSlotObjectBase *)0x0) {
      LOCK();
      (_Var3._M_head_impl)->m_ref = (QAtomicInt)(*(int *)&(_Var3._M_head_impl)->m_ref + 1);
      UNLOCK();
    }
    local_40.slot.obj._M_t.
    super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
    super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
    super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
         (SlotObjUniquePtr)
         (args->slot).obj._M_t.
         super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t
         .super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
         super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl;
    pVar5 = (piter)QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>::
                   emplace_helper<QRestAccessManagerPrivate::CallerInfo>
                             ((QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *)this,
                              key,&local_40);
    if (local_40.slot.obj._M_t.
        super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
        super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
        super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl !=
        (__uniq_ptr_data<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter,_true,_true>
         )0x0) {
      LOCK();
      *(int *)local_40.slot.obj._M_t.
              super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
              .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
           (int)*(QAtomicInteger<int> *)
                 local_40.slot.obj._M_t.
                 super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                 .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl + -1;
      UNLOCK();
      if ((__atomic_base<int>)
          *(Type *)local_40.slot.obj._M_t.
                   super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                   .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl == 0) {
        (**(ImplFn *)
           ((long)local_40.slot.obj._M_t.
                  super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                  .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl + 8))
                  (0,(QSlotObjectBase *)
                     local_40.slot.obj._M_t.
                     super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                     .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl,
                   (QObject *)0x0,(void **)0x0,(bool *)0x0);
      }
    }
    local_40.slot.obj._M_t.
    super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
    super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
    super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
         (SlotObjUniquePtr)
         (__uniq_ptr_data<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter,_true,_true>
          )0x0;
    if (local_40.contextObject.wp.d != (Data *)0x0) {
      LOCK();
      ((local_40.contextObject.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((local_40.contextObject.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((local_40.contextObject.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i == 0) &&
         (local_40.contextObject.wp.d != (Data *)0x0)) {
        operator_delete(local_40.contextObject.wp.d);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar5;
  }
LAB_00222a83:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }